

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-combiner.c
# Opt level: O0

void logical_or_with_cancel_vec(int n,int *vals,int *auxs,int *accum,int *accum_aux)

{
  int local_34;
  int i;
  int *accum_aux_local;
  int *accum_local;
  int *auxs_local;
  int *vals_local;
  int n_local;
  
  *accum = 0x7ffffffe;
  for (local_34 = 0; local_34 < n; local_34 = local_34 + 1) {
    logical_or_with_cancel_combine_accum_help(vals[local_34],accum);
  }
  if ((*accum != 0x7fffffff) && (*accum != 0x7ffffffe)) {
    if ((*accum & 2U) == 0) {
      if ((*accum != 0) && (*accum != 1)) {
        __assert_fail("*accum == 0 || *accum == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-entry-combiner.c"
                      ,0x20b,
                      "void logical_or_with_cancel_vec(int, const int *, const int *, int *, int *)"
                     );
      }
    }
    else {
      *accum = -1;
    }
  }
  *accum_aux = 0x7ffffffe;
  for (local_34 = 0; local_34 < n; local_34 = local_34 + 1) {
    logical_or_with_cancel_combine_accum_help(auxs[local_34],accum_aux);
  }
  if ((*accum_aux != 0x7fffffff) && (*accum_aux != 0x7ffffffe)) {
    if ((*accum_aux & 2U) == 0) {
      if ((*accum_aux != 0) && (*accum_aux != 1)) {
        __assert_fail("*accum_aux == 0 || *accum_aux == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-entry-combiner.c"
                      ,0x218,
                      "void logical_or_with_cancel_vec(int, const int *, const int *, int *, int *)"
                     );
      }
    }
    else {
      *accum_aux = -1;
    }
  }
  return;
}

Assistant:

static void logical_or_with_cancel_vec(int n, const int *vals, const int *auxs,
	int *accum, int *accum_aux)
{
	int i;

	*accum = UI_ENTRY_VALUE_NOT_PRESENT;
	for (i = 0; i < n; ++i) {
		logical_or_with_cancel_combine_accum_help(vals[i], accum);
	}
	if (*accum != UI_ENTRY_UNKNOWN_VALUE &&
		*accum != UI_ENTRY_VALUE_NOT_PRESENT) {
		if ((*accum & 2) != 0) {
			*accum = -1;
		} else {
			assert(*accum == 0 || *accum == 1);
		}
	}

	*accum_aux = UI_ENTRY_VALUE_NOT_PRESENT;
	for (i = 0; i < n; ++i) {
		logical_or_with_cancel_combine_accum_help(auxs[i], accum_aux);
	}
	if (*accum_aux != UI_ENTRY_UNKNOWN_VALUE &&
		*accum_aux != UI_ENTRY_VALUE_NOT_PRESENT) {
		if ((*accum_aux & 2) != 0) {
			*accum_aux = -1;
		} else {
			assert(*accum_aux == 0 || *accum_aux == 1);
		}
	}
}